

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QDateTimeEditPrivate::syncCalendarWidget(QDateTimeEditPrivate *this)

{
  QCalendarPopup *pQVar1;
  QDate QVar2;
  QDate date;
  QCalendarWidget *pQVar3;
  bool bVar4;
  
  if (this->monthCalendar != (QCalendarPopup *)0x0) {
    bVar4 = SUB81(this->monthCalendar,0);
    QObject::blockSignals(bVar4);
    pQVar1 = this->monthCalendar;
    QVar2.jd = ::QVariant::toDate();
    date.jd = ::QVariant::toDate();
    pQVar3 = QCalendarPopup::verifyCalendarInstance(pQVar1);
    QCalendarWidget::setMinimumDate(pQVar3,QVar2);
    QCalendarWidget::setMaximumDate(pQVar3,date);
    pQVar1 = this->monthCalendar;
    QVar2.jd = ::QVariant::toDate();
    (pQVar1->oldDate).jd = QVar2.jd;
    pQVar3 = QCalendarPopup::verifyCalendarInstance(pQVar1);
    QCalendarWidget::setSelectedDate(pQVar3,QVar2);
    QObject::blockSignals(bVar4);
    return;
  }
  return;
}

Assistant:

void QDateTimeEditPrivate::syncCalendarWidget()
{
    Q_Q(QDateTimeEdit);
    if (monthCalendar) {
        const QSignalBlocker blocker(monthCalendar);
        monthCalendar->setDateRange(q->minimumDate(), q->maximumDate());
        monthCalendar->setDate(q->date());
    }
}